

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

string_view slang::timeUnitToSuffix(TimeUnit unit)

{
  byte in_DIL;
  string_view sVar1;
  
  sVar1 = (string_view)(*(code *)(&DAT_00aa1b40 + *(int *)(&DAT_00aa1b40 + (ulong)in_DIL * 4)))();
  return sVar1;
}

Assistant:

std::string_view timeUnitToSuffix(TimeUnit unit) {
    switch (unit) {
        case TimeUnit::Seconds:
            return "s";
        case TimeUnit::Milliseconds:
            return "ms";
        case TimeUnit::Microseconds:
            return "us";
        case TimeUnit::Nanoseconds:
            return "ns";
        case TimeUnit::Picoseconds:
            return "ps";
        case TimeUnit::Femtoseconds:
            return "fs";
    }
    SLANG_UNREACHABLE;
}